

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O3

void __thiscall so_5::agent_t::do_state_switch(agent_t *this,state_t *state_to_be_set)

{
  state_t **ppsVar1;
  state_t *psVar2;
  state_t *psVar3;
  bool bVar4;
  state_t *psVar5;
  state_t *psVar6;
  ulong uVar7;
  tracer_t *ptVar8;
  state_t *psVar9;
  size_t i;
  ulong uVar10;
  ulong uVar11;
  internal_env_iface_t env;
  path_t new_path;
  path_t old_path;
  internal_env_iface_t local_148;
  state_t *local_140;
  agent_t *local_138;
  composed_action_name local_130;
  long alStack_120 [16];
  long alStack_a0 [16];
  
  psVar9 = this->m_current_state_ptr;
  psVar5 = psVar9;
  do {
    alStack_a0[psVar5->m_nested_level] = (long)psVar5;
    psVar5 = psVar5->m_parent_state;
    psVar6 = state_to_be_set;
  } while (psVar5 != (state_t *)0x0);
  do {
    alStack_120[psVar6->m_nested_level] = (long)psVar6;
    ppsVar1 = &psVar6->m_parent_state;
    psVar6 = *ppsVar1;
  } while (*ppsVar1 != (state_t *)0x0);
  uVar7 = psVar9->m_nested_level;
  if (state_to_be_set->m_nested_level < psVar9->m_nested_level) {
    uVar7 = state_to_be_set->m_nested_level;
  }
  uVar10 = 0;
  uVar11 = uVar10;
  if (uVar7 != 0) {
    do {
      uVar11 = uVar10;
      if (alStack_a0[uVar10] != alStack_120[uVar10]) break;
      uVar10 = uVar10 + 1;
      uVar11 = uVar7;
    } while (uVar7 != uVar10);
  }
  local_148.m_env = this->m_env;
  bVar4 = impl::internal_env_iface_t::is_msg_tracing_enabled(&local_148);
  if (bVar4) {
    ptVar8 = impl::internal_env_iface_t::msg_tracer(&local_148);
    local_130.m_1 = "state";
    local_130.m_2 = "leaving";
    local_140 = psVar9;
    local_138 = this;
    impl::msg_tracing_helpers::details::
    make_trace<so_5::agent_t_const*,so_5::impl::msg_tracing_helpers::details::composed_action_name,so_5::state_t_const*>
              (ptVar8,&local_138,&local_130,&local_140);
  }
  uVar7 = this->m_current_state_ptr->m_nested_level;
  do {
    if (uVar7 < uVar11) break;
    uVar10 = uVar7 - 1;
    state_t::call_on_exit((state_t *)alStack_a0[uVar7]);
    uVar7 = uVar10;
  } while (uVar10 != 0xffffffffffffffff);
  local_148.m_env = this->m_env;
  bVar4 = impl::internal_env_iface_t::is_msg_tracing_enabled(&local_148);
  if (bVar4) {
    ptVar8 = impl::internal_env_iface_t::msg_tracer(&local_148);
    local_130.m_1 = "state";
    local_130.m_2 = "entering";
    local_140 = state_to_be_set;
    local_138 = this;
    impl::msg_tracing_helpers::details::
    make_trace<so_5::agent_t_const*,so_5::impl::msg_tracing_helpers::details::composed_action_name,so_5::state_t_const*>
              (ptVar8,&local_138,&local_130,&local_140);
  }
  for (; uVar11 <= state_to_be_set->m_nested_level; uVar11 = uVar11 + 1) {
    state_t::call_on_enter((state_t *)alStack_120[uVar11]);
  }
  this->m_current_state_ptr = state_to_be_set;
  psVar3 = state_to_be_set->m_parent_state;
  psVar9 = state_to_be_set;
  while (psVar2 = psVar3, psVar2 != (state_t *)0x0) {
    if ((psVar2->m_state_history == shallow) ||
       (psVar9 = state_to_be_set, psVar2->m_state_history == deep)) {
      psVar2->m_last_active_substate = psVar9;
    }
    psVar9 = psVar2;
    psVar3 = psVar2->m_parent_state;
  }
  return;
}

Assistant:

void
agent_t::do_state_switch(
	const state_t & state_to_be_set )
{
	state_t::path_t old_path;
	state_t::path_t new_path;

	m_current_state_ptr->fill_path( old_path );
	state_to_be_set.fill_path( new_path );

	// Find the first item which is different in the paths.
	std::size_t first_diff = 0;
	for(; first_diff < std::min(
				m_current_state_ptr->nested_level(),
				state_to_be_set.nested_level() );
			++first_diff )
		if( old_path[ first_diff ] != new_path[ first_diff ] )
			break;

	// Do call for on_exit and on_enter for states.
	// on_exit and on_enter should not throw exceptions.
	so_5::details::invoke_noexcept_code( [&] {

		impl::msg_tracing_helpers::safe_trace_state_leaving(
				*this, *m_current_state_ptr );
		for( std::size_t i = m_current_state_ptr->nested_level();
				i >= first_diff; )
			{
				old_path[ i ]->call_on_exit();
				if( i )
					--i;
				else
					break;
			}

		impl::msg_tracing_helpers::safe_trace_state_entering(
				*this, state_to_be_set );
		for( std::size_t i = first_diff;
				i <= state_to_be_set.nested_level();
				++i )
			{
				new_path[ i ]->call_on_enter();
			}
	} );

	// Now the current state for the agent can be changed.
	m_current_state_ptr = &state_to_be_set;
	m_current_state_ptr->update_history_in_parent_states();
}